

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<char> * __thiscall
irr::core::string<char>::subString
          (string<char> *__return_storage_ptr__,string<char> *this,u32 begin,s32 length,
          bool make_lower)

{
  string asStack_38 [32];
  
  if ((length < 1) || ((uint)(this->str)._M_string_length <= begin)) {
    string<char>(__return_storage_ptr__,"");
  }
  else {
    ::std::__cxx11::string::substr((ulong)asStack_38,(ulong)this);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,asStack_38);
    ::std::__cxx11::string::_M_dispose();
    if (make_lower) {
      string<char>::make_lower(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string<T> subString(u32 begin, s32 length, bool make_lower = false) const
	{
		// if start after string
		// or no proper substring length
		if ((length <= 0) || (begin >= size()))
			return string<T>("");

		string<T> o = str.substr(begin, length);
		if (make_lower)
			o.make_lower();
		return o;
	}